

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

int __thiscall amrex::Amr::initInSitu(Amr *this)

{
  return 0;
}

Assistant:

int
Amr::initInSitu()
{
#if defined(AMREX_USE_SENSEI_INSITU) && !defined(AMREX_NO_SENSEI_AMR_INST)
    insitu_bridge = new AmrInSituBridge;
    if (insitu_bridge->initialize())
    {
        amrex::ErrorStream() << "Amr::initInSitu : Failed to initialize." << std::endl;
        amrex::Abort();
    }
#endif
    return 0;
}